

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O2

TestNode *
deqp::gls::Functional::ScissorTestInternal::createPrimitiveTest
          (TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc,Vec4 *scissorArea,
          Vec4 *renderArea,PrimitiveType type,int primitiveCount)

{
  ScissorCase *this;
  
  this = (ScissorCase *)operator_new(0xa0);
  Functional::anon_unknown_0::ScissorCase::ScissorCase(this,testCtx,renderCtx,name,desc,scissorArea)
  ;
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e761c0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(this + 1),renderArea);
  *(PrimitiveType *)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = type;
  *(int *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
       primitiveCount;
  return (TestNode *)this;
}

Assistant:

tcu::TestNode* createPrimitiveTest (tcu::TestContext&	testCtx,
									glu::RenderContext&	renderCtx,
									const char*			name,
									const char*			desc,
									const Vec4&			scissorArea,
									const Vec4&			renderArea,
									PrimitiveType		type,
									int					primitiveCount)
{
	return new ScissorPrimitiveCase(testCtx, renderCtx, name, desc, scissorArea, renderArea, type, primitiveCount);
}